

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O0

int zeromult2(int i)

{
  bool bVar1;
  symboltype sVar2;
  float fVar3;
  int i_local;
  
  bVar1 = false;
  if (intcode[i].opcode == opmult) {
    sVar2 = symclass(intcode[i].op3.opnd);
    bVar1 = false;
    if (sVar2 == stliteral) {
      fVar3 = getvalue(intcode[i].op3.opnd);
      bVar1 = fVar3 == 0.0;
    }
  }
  return (uint)bVar1;
}

Assistant:

int	zeromult2(int i)
{
    return((intcode[i].opcode == opmult
            && symclass(intcode[i].op3.opnd) == stliteral
            && getvalue(intcode[i].op3.opnd) == 0)? TRUE
           : FALSE);
}